

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int BackwardReferencesHashChainDistanceOnly
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs,uint16_t *dist_array)

{
  int iVar1;
  int iVar2;
  CostManager *manager;
  void *distance_cost;
  int64_t *cost;
  int in_ECX;
  int in_ESI;
  int in_EDI;
  long in_R9;
  CostModel *in_stack_00000008;
  int j;
  int len_j;
  int offset_j;
  int code;
  int len;
  int offset;
  int64_t prev_cost;
  int reach;
  int first_offset_is_constant;
  int64_t offset_cost;
  int len_prev;
  int offset_prev;
  CostManager *cost_manager;
  VP8LColorCache hashers;
  CostModel *cost_model;
  size_t cost_model_size;
  size_t literal_array_size;
  int use_color_cache;
  int pix_count;
  int cc_init;
  int ok;
  int i;
  VP8LColorCache *in_stack_ffffffffffffff48;
  int *length_ptr;
  size_t in_stack_ffffffffffffff50;
  CostModel *m;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CostModel *in_stack_ffffffffffffff70;
  CostModel *cost_model_00;
  int xsize_00;
  CostModel *m_00;
  int local_78;
  int local_74;
  uint16_t *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_34;
  uint local_30;
  int local_2c;
  
  local_30 = 0;
  local_34 = 0;
  iVar1 = VP8LHistogramNumCodes(in_ECX);
  manager = (CostManager *)((long)iVar1 * 4 + 0xca8);
  distance_cost =
       WebPSafeCalloc(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50);
  cost = (int64_t *)
         WebPSafeCalloc(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff50);
  local_74 = -1;
  local_78 = -1;
  m_00 = (CostModel *)0xffffffffffffffff;
  xsize_00 = -1;
  iVar1 = 0;
  if ((((distance_cost != (void *)0x0) && (cost != (int64_t *)0x0)) &&
      ((*(long *)((long)distance_cost + 0xca0) = (long)distance_cost + 0xca8, in_ECX < 1 ||
       (local_34 = VP8LColorCacheInit(in_stack_ffffffffffffff48,0), local_34 != 0)))) &&
     ((iVar2 = CostModelBuild(m_00,xsize_00,iVar1,(VP8LBackwardRefs *)in_stack_ffffffffffffff70),
      iVar2 != 0 &&
      (iVar2 = CostManagerInit((CostManager *)CONCAT44(xsize_00,iVar1),
                               (uint16_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                               (CostModel *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
      iVar2 != 0)))) {
    *(undefined2 *)in_stack_00000008->alpha_ = 0;
    length_ptr = (int *)cost[0x1003];
    m = in_stack_00000008;
    AddSingleLiteralWithCostModel
              (m_00->alpha_,(VP8LColorCache *)CONCAT44(xsize_00,iVar1),in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),cost,
               in_stack_ffffffffffffff98);
    for (local_2c = 1; local_2c < in_EDI * in_ESI; local_2c = local_2c + 1) {
      cost_model_00 = *(CostModel **)(cost[0x1003] + (long)(local_2c + -1) * 8);
      VP8LHashChainFindCopy
                ((VP8LHashChain *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,(int *)m,length_ptr);
      length_ptr = (int *)cost[0x1003];
      m = in_stack_00000008;
      AddSingleLiteralWithCostModel
                (m_00->alpha_,(VP8LColorCache *)CONCAT44(xsize_00,iVar1),cost_model_00,
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),cost,
                 in_stack_ffffffffffffff98);
      if (1 < in_stack_ffffffffffffff68) {
        if (in_stack_ffffffffffffff6c == local_74) {
          if (xsize_00 != 0) {
            iVar1 = local_2c + local_78 + -2;
            xsize_00 = 0;
          }
          if (iVar1 < local_2c + in_stack_ffffffffffffff68 + -1) {
            in_stack_ffffffffffffff5c = 0;
            for (in_stack_ffffffffffffff58 = local_2c; in_stack_ffffffffffffff58 <= iVar1;
                in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
              VP8LHashChainFindCopy
                        ((VP8LHashChain *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c,(int *)m,length_ptr);
              if (in_stack_ffffffffffffff60 != in_stack_ffffffffffffff6c) {
                VP8LHashChainFindCopy
                          ((VP8LHashChain *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,(int *)m,length_ptr);
                break;
              }
            }
            UpdateCostAtIndex((CostManager *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
            UpdateCostAtIndex((CostManager *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
            PushInterval(manager,(int64_t)distance_cost,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffffa0);
            iVar1 = in_stack_ffffffffffffff58 + in_stack_ffffffffffffff5c + -1;
          }
        }
        else {
          in_stack_ffffffffffffff64 = VP8LDistanceToPlaneCode(in_EDI,in_stack_ffffffffffffff6c);
          m_00 = (CostModel *)GetDistanceCost(m,(uint32_t)((ulong)length_ptr >> 0x20));
          xsize_00 = 1;
          PushInterval(manager,(int64_t)distance_cost,in_stack_ffffffffffffffa4,
                       in_stack_ffffffffffffffa0);
        }
      }
      UpdateCostAtIndex((CostManager *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                        ,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      local_78 = in_stack_ffffffffffffff68;
      local_74 = in_stack_ffffffffffffff6c;
    }
    local_30 = (uint)((*(int *)(in_R9 + 4) != 0 ^ 0xffU) & 1);
  }
  if (local_34 != 0) {
    VP8LColorCacheClear((VP8LColorCache *)0x19e02b);
  }
  CostManagerClear((CostManager *)0x19e035);
  WebPSafeFree((void *)0x19e03f);
  WebPSafeFree((void *)0x19e049);
  return local_30;
}

Assistant:

static int BackwardReferencesHashChainDistanceOnly(
    int xsize, int ysize, const uint32_t* const argb, int cache_bits,
    const VP8LHashChain* const hash_chain, const VP8LBackwardRefs* const refs,
    uint16_t* const dist_array) {
  int i;
  int ok = 0;
  int cc_init = 0;
  const int pix_count = xsize * ysize;
  const int use_color_cache = (cache_bits > 0);
  const size_t literal_array_size =
      sizeof(*((CostModel*)NULL)->literal_) * VP8LHistogramNumCodes(cache_bits);
  const size_t cost_model_size = sizeof(CostModel) + literal_array_size;
  CostModel* const cost_model =
      (CostModel*)WebPSafeCalloc(1ULL, cost_model_size);
  VP8LColorCache hashers;
  CostManager* cost_manager =
      (CostManager*)WebPSafeCalloc(1ULL, sizeof(*cost_manager));
  int offset_prev = -1, len_prev = -1;
  int64_t offset_cost = -1;
  int first_offset_is_constant = -1;  // initialized with 'impossible' value
  int reach = 0;

  if (cost_model == NULL || cost_manager == NULL) goto Error;

  cost_model->literal_ = (uint32_t*)(cost_model + 1);
  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }

  if (!CostModelBuild(cost_model, xsize, cache_bits, refs)) {
    goto Error;
  }

  if (!CostManagerInit(cost_manager, dist_array, pix_count, cost_model)) {
    goto Error;
  }

  // We loop one pixel at a time, but store all currently best points to
  // non-processed locations from this point.
  dist_array[0] = 0;
  // Add first pixel as literal.
  AddSingleLiteralWithCostModel(argb, &hashers, cost_model, /*idx=*/0,
                                use_color_cache, /*prev_cost=*/0,
                                cost_manager->costs_, dist_array);

  for (i = 1; i < pix_count; ++i) {
    const int64_t prev_cost = cost_manager->costs_[i - 1];
    int offset, len;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);

    // Try adding the pixel as a literal.
    AddSingleLiteralWithCostModel(argb, &hashers, cost_model, i,
                                  use_color_cache, prev_cost,
                                  cost_manager->costs_, dist_array);

    // If we are dealing with a non-literal.
    if (len >= 2) {
      if (offset != offset_prev) {
        const int code = VP8LDistanceToPlaneCode(xsize, offset);
        offset_cost = GetDistanceCost(cost_model, code);
        first_offset_is_constant = 1;
        PushInterval(cost_manager, prev_cost + offset_cost, i, len);
      } else {
        assert(offset_cost >= 0);
        assert(len_prev >= 0);
        assert(first_offset_is_constant == 0 || first_offset_is_constant == 1);
        // Instead of considering all contributions from a pixel i by calling:
        //         PushInterval(cost_manager, prev_cost + offset_cost, i, len);
        // we optimize these contributions in case offset_cost stays the same
        // for consecutive pixels. This describes a set of pixels similar to a
        // previous set (e.g. constant color regions).
        if (first_offset_is_constant) {
          reach = i - 1 + len_prev - 1;
          first_offset_is_constant = 0;
        }

        if (i + len - 1 > reach) {
          // We can only be go further with the same offset if the previous
          // length was maxed, hence len_prev == len == MAX_LENGTH.
          // TODO(vrabaud), bump i to the end right away (insert cache and
          // update cost).
          // TODO(vrabaud), check if one of the points in between does not have
          // a lower cost.
          // Already consider the pixel at "reach" to add intervals that are
          // better than whatever we add.
          int offset_j, len_j = 0;
          int j;
          assert(len == MAX_LENGTH || len == pix_count - i);
          // Figure out the last consecutive pixel within [i, reach + 1] with
          // the same offset.
          for (j = i; j <= reach; ++j) {
            VP8LHashChainFindCopy(hash_chain, j + 1, &offset_j, &len_j);
            if (offset_j != offset) {
              VP8LHashChainFindCopy(hash_chain, j, &offset_j, &len_j);
              break;
            }
          }
          // Update the cost at j - 1 and j.
          UpdateCostAtIndex(cost_manager, j - 1, 0);
          UpdateCostAtIndex(cost_manager, j, 0);

          PushInterval(cost_manager, cost_manager->costs_[j - 1] + offset_cost,
                       j, len_j);
          reach = j + len_j - 1;
        }
      }
    }

    UpdateCostAtIndex(cost_manager, i, 1);
    offset_prev = offset;
    len_prev = len;
  }

  ok = !refs->error_;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  CostManagerClear(cost_manager);
  WebPSafeFree(cost_model);
  WebPSafeFree(cost_manager);
  return ok;
}